

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O0

string * to_string_abi_cxx11_(string *__return_storage_ptr__,TrackEncoding track_encoding)

{
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  TrackEncoding local_14;
  string *psStack_10;
  TrackEncoding track_encoding_local;
  
  local_14 = track_encoding;
  psStack_10 = __return_storage_ptr__;
  if (track_encoding == ISOIBM_MFM_ENCODING) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ISOIBM_MFM_ENCODING",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (track_encoding == AMIGA_MFM_ENCODING) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"AMIGA_MFM_ENCODING",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else if (track_encoding == ISOIBM_FM_ENCODING) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ISOIBM_FM_ENCODING",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  else if (track_encoding == EMU_FM_ENCODING) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"EMU_FM_ENCODING",&local_27);
    std::allocator<char>::~allocator(&local_27);
  }
  else if (track_encoding == UNKNOWN_ENCODING) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UNKNOWN_ENCODING",&local_28);
    std::allocator<char>::~allocator(&local_28);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(TrackEncoding track_encoding)
{
    switch (track_encoding)
    {
    case ISOIBM_MFM_ENCODING:   return "ISOIBM_MFM_ENCODING";   break;
    case AMIGA_MFM_ENCODING:    return "AMIGA_MFM_ENCODING";    break;
    case ISOIBM_FM_ENCODING:    return "ISOIBM_FM_ENCODING";    break;
    case EMU_FM_ENCODING:       return "EMU_FM_ENCODING";       break;
    case UNKNOWN_ENCODING:      return "UNKNOWN_ENCODING";      break;
    }
    return "Unknown";
}